

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddDefaultValue(Parse *pParse,ExprSpan *pSpan)

{
  Table *pTVar1;
  int iVar2;
  Column *pCVar3;
  Expr *pEVar4;
  undefined1 local_78 [8];
  Expr x;
  sqlite3 *db;
  Column *pCol;
  Table *p;
  ExprSpan *pSpan_local;
  Parse *pParse_local;
  
  x.pTab = (Table *)pParse->db;
  pTVar1 = pParse->pNewTable;
  if (pTVar1 != (Table *)0x0) {
    pCVar3 = pTVar1->aCol + (pTVar1->nCol + -1);
    iVar2 = sqlite3ExprIsConstantOrFunction(pSpan->pExpr,(((sqlite3 *)x.pTab)->init).busy);
    if (iVar2 == 0) {
      sqlite3ErrorMsg(pParse,"default value of column [%s] is not constant",pCVar3->zName);
    }
    else {
      sqlite3ExprDelete((sqlite3 *)x.pTab,pCVar3->pDflt);
      memset(local_78,0,0x48);
      local_78[0] = 0xa2;
      x._0_8_ = sqlite3DbStrNDup((sqlite3 *)x.pTab,pSpan->zStart,
                                 (long)((int)pSpan->zEnd - (int)pSpan->zStart));
      x.u = (anon_union_8_2_443a03b8_for_u)pSpan->pExpr;
      local_78._4_4_ = 0x1000;
      pEVar4 = sqlite3ExprDup((sqlite3 *)x.pTab,(Expr *)local_78,1);
      pCVar3->pDflt = pEVar4;
      sqlite3DbFree((sqlite3 *)x.pTab,(void *)x._0_8_);
    }
  }
  sqlite3ExprDelete((sqlite3 *)x.pTab,pSpan->pExpr);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddDefaultValue(Parse *pParse, ExprSpan *pSpan){
  Table *p;
  Column *pCol;
  sqlite3 *db = pParse->db;
  p = pParse->pNewTable;
  if( p!=0 ){
    pCol = &(p->aCol[p->nCol-1]);
    if( !sqlite3ExprIsConstantOrFunction(pSpan->pExpr, db->init.busy) ){
      sqlite3ErrorMsg(pParse, "default value of column [%s] is not constant",
          pCol->zName);
    }else{
      /* A copy of pExpr is used instead of the original, as pExpr contains
      ** tokens that point to volatile memory. The 'span' of the expression
      ** is required by pragma table_info.
      */
      Expr x;
      sqlite3ExprDelete(db, pCol->pDflt);
      memset(&x, 0, sizeof(x));
      x.op = TK_SPAN;
      x.u.zToken = sqlite3DbStrNDup(db, (char*)pSpan->zStart,
                                    (int)(pSpan->zEnd - pSpan->zStart));
      x.pLeft = pSpan->pExpr;
      x.flags = EP_Skip;
      pCol->pDflt = sqlite3ExprDup(db, &x, EXPRDUP_REDUCE);
      sqlite3DbFree(db, x.u.zToken);
    }
  }
  sqlite3ExprDelete(db, pSpan->pExpr);
}